

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathway.c
# Opt level: O0

pathway_mode_t parse_pathway_mode(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    value_local._4_4_ = PTMD_WALKWAY;
  }
  else {
    iVar1 = strcmp(value,"2");
    if (iVar1 == 0) {
      value_local._4_4_ = PTMD_STAIRS;
    }
    else {
      iVar1 = strcmp(value,"3");
      if (iVar1 == 0) {
        value_local._4_4_ = PTMD_MOVING;
      }
      else {
        iVar1 = strcmp(value,"4");
        if (iVar1 == 0) {
          value_local._4_4_ = PTMD_ESCALATOR;
        }
        else {
          iVar1 = strcmp(value,"5");
          if (iVar1 == 0) {
            value_local._4_4_ = PTMD_ELEVATOR;
          }
          else {
            iVar1 = strcmp(value,"6");
            if (iVar1 == 0) {
              value_local._4_4_ = PTMD_PAYGATE;
            }
            else {
              iVar1 = strcmp(value,"7");
              if (iVar1 == 0) {
                value_local._4_4_ = PTMD_EXITGATE;
              }
              else {
                value_local._4_4_ = PTMD_NOT_SET;
              }
            }
          }
        }
      }
    }
  }
  return value_local._4_4_;
}

Assistant:

pathway_mode_t parse_pathway_mode(const char *value) {
    if (strcmp(value, "1") == 0)
        return PTMD_WALKWAY;
    else if (strcmp(value, "2") == 0)
        return PTMD_STAIRS;
    else if (strcmp(value, "3") == 0)
        return PTMD_MOVING;
    else if (strcmp(value, "4") == 0)
        return PTMD_ESCALATOR;
    else if (strcmp(value, "5") == 0)
        return PTMD_ELEVATOR;
    else if (strcmp(value, "6") == 0)
        return PTMD_PAYGATE;
    else if (strcmp(value, "7") == 0)
        return PTMD_EXITGATE;
    else
        return PTMD_NOT_SET;
}